

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i2p.cpp
# Opt level: O2

bool __thiscall i2p::sam::Session::Accept(Session *this,Connection *conn)

{
  long lVar1;
  _Head_base<0UL,_Sock_*,_false> _Var2;
  string_view source_file;
  bool bVar3;
  char cVar4;
  Logger *pLVar5;
  Level level;
  Connection *pCVar6;
  CThreadInterrupt *in_R8;
  int iVar7;
  long in_FS_OFFSET;
  string_view logging_function;
  string_view source_file_00;
  string_view str;
  string_view logging_function_00;
  char *in_stack_fffffffffffffea0;
  char *local_128;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_120;
  string log_msg;
  string errmsg;
  Event occurred;
  CNetAddr peer_addr;
  string peer_dest;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  errmsg._M_dataplus._M_p = (pointer)&errmsg.field_2;
  errmsg._M_string_length = 0;
  errmsg.field_2._M_local_buf[0] = '\0';
  pCVar6 = conn;
  do {
    level = (Level)pCVar6;
    bVar3 = CThreadInterrupt::operator_cast_to_bool(this->m_interrupt);
    if (bVar3) goto LAB_003d2fda;
    _Var2._M_head_impl =
         (conn->sock)._M_t.super___uniq_ptr_impl<Sock,_std::default_delete<Sock>_>._M_t.
         super__Tuple_impl<0UL,_Sock_*,_std::default_delete<Sock>_>.
         super__Head_base<0UL,_Sock_*,_false>._M_head_impl;
    pCVar6 = (Connection *)&DAT_000003e8;
    cVar4 = (**(code **)((long)(_Var2._M_head_impl)->_vptr_Sock + 0x70))
                      (_Var2._M_head_impl,1000,1,&occurred);
    if (cVar4 == '\0') {
      level = 0x6e265d;
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
                (&errmsg,"wait on socket failed");
      goto LAB_003d2fda;
    }
    if (occurred == '\0') {
      iVar7 = 2;
    }
    else {
      peer_dest._M_dataplus._M_p = (pointer)&peer_dest.field_2;
      peer_dest._M_string_length = 0;
      peer_dest.field_2._M_local_buf[0] = '\0';
      _Var2._M_head_impl =
           (conn->sock)._M_t.super___uniq_ptr_impl<Sock,_std::default_delete<Sock>_>._M_t.
           super__Tuple_impl<0UL,_Sock_*,_std::default_delete<Sock>_>.
           super__Head_base<0UL,_Sock_*,_false>._M_head_impl;
      in_R8 = this->m_interrupt;
      (**(code **)((long)(_Var2._M_head_impl)->_vptr_Sock + 0x90))
                ((Connection *)&log_msg,_Var2._M_head_impl,10,1000);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (&peer_dest,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&log_msg);
      std::__cxx11::string::~string((string *)&log_msg);
      CNetAddr::CNetAddr(&peer_addr);
      DecodeI2PBase64((Binary *)&local_120,&peer_dest);
      DestBinToAddr((CNetAddr *)&log_msg,(Binary *)&local_120);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_120);
      CNetAddr::operator=(&peer_addr,(CNetAddr *)&log_msg);
      prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
                ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&log_msg);
      CService::CService((CService *)&log_msg,&peer_addr,0);
      pCVar6 = (Connection *)&log_msg;
      CService::operator=(&conn->peer,(CService *)&log_msg);
      prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
                ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&log_msg);
      iVar7 = 1;
      prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector(&peer_addr.m_addr);
      std::__cxx11::string::~string((string *)&peer_dest);
    }
    level = (Level)pCVar6;
  } while (iVar7 == 2);
  if (iVar7 == 3) {
LAB_003d2fda:
    bVar3 = CThreadInterrupt::operator_cast_to_bool(this->m_interrupt);
    if (bVar3) {
      bVar3 = ::LogAcceptCategory(NET,level);
      if (bVar3) {
        logging_function._M_str = "Accept";
        logging_function._M_len = 6;
        source_file_00._M_str =
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/i2p.cpp";
        source_file_00._M_len = 0x50;
        ::LogPrintf_<>(logging_function,source_file_00,0xd0,NET,0x6e26c3,in_stack_fffffffffffffea0);
      }
    }
    else {
      bVar3 = ::LogAcceptCategory(NET,level);
      if (bVar3) {
        local_128 = "";
        pLVar5 = LogInstance();
        bVar3 = BCLog::Logger::Enabled(pLVar5);
        if (bVar3) {
          log_msg._M_dataplus._M_p = (pointer)&log_msg.field_2;
          log_msg._M_string_length = 0;
          log_msg.field_2._M_local_buf[0] = '\0';
          tinyformat::format<char_const*,std::__cxx11::string>
                    (&peer_dest,(tinyformat *)"Error accepting%s: %s\n",(char *)&local_128,
                     (char **)&errmsg,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_R8);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                    (&log_msg,&peer_dest);
          std::__cxx11::string::~string((string *)&peer_dest);
          pLVar5 = LogInstance();
          peer_dest._M_dataplus._M_p = &DAT_00000050;
          peer_dest._M_string_length = (size_type)anon_var_dwarf_eae640;
          source_file._M_str =
               "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/i2p.cpp";
          source_file._M_len = 0x50;
          str._M_str = log_msg._M_dataplus._M_p;
          str._M_len = log_msg._M_string_length;
          logging_function_00._M_str = "Accept";
          logging_function_00._M_len = 6;
          BCLog::Logger::LogPrintStr(pLVar5,str,logging_function_00,source_file,0xd2,I2P,Debug);
          std::__cxx11::string::~string((string *)&log_msg);
        }
      }
    }
    CheckControlSock(this);
    bVar3 = false;
  }
  else {
    bVar3 = true;
  }
  std::__cxx11::string::~string((string *)&errmsg);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return bVar3;
}

Assistant:

bool Session::Accept(Connection& conn)
{
    AssertLockNotHeld(m_mutex);

    std::string errmsg;
    bool disconnect{false};

    while (!*m_interrupt) {
        Sock::Event occurred;
        if (!conn.sock->Wait(MAX_WAIT_FOR_IO, Sock::RECV, &occurred)) {
            errmsg = "wait on socket failed";
            break;
        }

        if (occurred == 0) {
            // Timeout, no incoming connections or errors within MAX_WAIT_FOR_IO.
            continue;
        }

        std::string peer_dest;
        try {
            peer_dest = conn.sock->RecvUntilTerminator('\n', MAX_WAIT_FOR_IO, *m_interrupt, MAX_MSG_SIZE);
        } catch (const std::runtime_error& e) {
            errmsg = e.what();
            break;
        }

        CNetAddr peer_addr;
        try {
            peer_addr = DestB64ToAddr(peer_dest);
        } catch (const std::runtime_error& e) {
            // The I2P router is expected to send the Base64 of the connecting peer,
            // but it may happen that something like this is sent instead:
            // STREAM STATUS RESULT=I2P_ERROR MESSAGE="Session was closed"
            // In that case consider the session damaged and close it right away,
            // even if the control socket is alive.
            if (peer_dest.find("RESULT=I2P_ERROR") != std::string::npos) {
                errmsg = strprintf("unexpected reply that hints the session is unusable: %s", peer_dest);
                disconnect = true;
            } else {
                errmsg = e.what();
            }
            break;
        }

        conn.peer = CService(peer_addr, I2P_SAM31_PORT);

        return true;
    }

    if (*m_interrupt) {
        LogPrintLevel(BCLog::I2P, BCLog::Level::Debug, "Accept was interrupted\n");
    } else {
        LogPrintLevel(BCLog::I2P, BCLog::Level::Debug, "Error accepting%s: %s\n", disconnect ? " (will close the session)" : "", errmsg);
    }
    if (disconnect) {
        LOCK(m_mutex);
        Disconnect();
    } else {
        CheckControlSock();
    }
    return false;
}